

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O0

void h_store_32_unpacklo(uint16_t **dst,ptrdiff_t stride,__m128i *row)

{
  uint16_t *puVar1;
  longlong lVar2;
  __m128i val;
  __m128i *row_local;
  ptrdiff_t stride_local;
  uint16_t **dst_local;
  
  lVar2 = (*row)[0];
  puVar1 = *dst;
  *(longlong *)puVar1 = lVar2;
  *(longlong *)(puVar1 + 4) = lVar2;
  puVar1 = *dst;
  *(longlong *)(puVar1 + 8) = lVar2;
  *(longlong *)(puVar1 + 0xc) = lVar2;
  puVar1 = *dst;
  *(longlong *)(puVar1 + 0x10) = lVar2;
  *(longlong *)(puVar1 + 0x14) = lVar2;
  puVar1 = *dst;
  *(longlong *)(puVar1 + 0x18) = lVar2;
  *(longlong *)(puVar1 + 0x1c) = lVar2;
  *dst = *dst + stride;
  return;
}

Assistant:

static inline void h_store_32_unpacklo(uint16_t **dst, const ptrdiff_t stride,
                                       const __m128i *row) {
  const __m128i val = _mm_unpacklo_epi64(*row, *row);
  _mm_store_si128((__m128i *)(*dst), val);
  _mm_store_si128((__m128i *)(*dst + 8), val);
  _mm_store_si128((__m128i *)(*dst + 16), val);
  _mm_store_si128((__m128i *)(*dst + 24), val);
  *dst += stride;
}